

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_zmqhub.c
# Opt level: O3

int csp_zmqhub_init(uint16_t addr,char *host,uint32_t flags,csp_iface_t **return_interface)

{
  uint uVar1;
  uint16_t *rxfilter;
  char sub [100];
  char pub [100];
  uint32_t in_stack_fffffffffffffef8;
  char local_f8 [112];
  char local_88 [112];
  
  uVar1 = snprintf(local_88,100,"tcp://%s:%u",host,6000);
  if (99 < uVar1) {
    local_88[0] = '\0';
  }
  uVar1 = snprintf(local_f8,100,"tcp://%s:%u",host,7000);
  if (99 < uVar1) {
    local_f8[0] = '\0';
  }
  csp_zmqhub_init_w_name_endpoints_rxfilter
            ((char *)0x0,addr,rxfilter,(uint)host,local_88,local_f8,in_stack_fffffffffffffef8,
             return_interface);
  return 0;
}

Assistant:

int csp_zmqhub_init(uint16_t addr,
					const char * host,
					uint32_t flags,
					csp_iface_t ** return_interface) {

	char pub[100];
	csp_zmqhub_make_endpoint(host, CSP_ZMQPROXY_SUBSCRIBE_PORT, pub, sizeof(pub));

	char sub[100];
	csp_zmqhub_make_endpoint(host, CSP_ZMQPROXY_PUBLISH_PORT, sub, sizeof(sub));

	return csp_zmqhub_init_w_endpoints(addr, pub, sub, flags, return_interface);
}